

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_math.cpp
# Opt level: O2

void __thiscall
mathOps_uncertainMeas_Test::mathOps_uncertainMeas_Test(mathOps_uncertainMeas_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00193068;
  return;
}

Assistant:

TEST(mathOps, uncertainMeas)
{
    uncertain_measurement um1(5.69F, 0.01F, m.pow(3));

    auto um2 = cbrt(um1);
    EXPECT_EQ(um2, root(um1, 3));

    auto um3 = floor(um1);
    EXPECT_FLOAT_EQ(um3.value_f(), 5.0F);

    auto um4 = trunc(um1);
    EXPECT_FLOAT_EQ(um4.value_f(), 5.0F);

    auto um5 = ceil(um1);
    EXPECT_FLOAT_EQ(um5.value_f(), 6.0F);

    auto um6 = round(um1);
    EXPECT_FLOAT_EQ(um6.value_f(), 6.0F);
}